

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form3_Flip(FlipForm3 Flip)

{
  uint8_t value;
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint32_t width;
  uint height;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  
  Unit_Test::intensityArray(&intensity,2);
  value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,0,0,&output);
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  Unit_Test::generateRoi(&input,&roiX,&roiY,&roiWidth,&roiHeight);
  uVar4 = rand();
  uVar4 = uVar4 & 1;
  uVar5 = rand();
  uVar2 = roiWidth;
  uVar1 = roiHeight;
  if ((uVar5 & 1) == 0) {
    if (1 < roiHeight) {
      height = roiHeight >> 1;
      width = roiWidth;
LAB_001504bf:
      Image_Function::Fill
                (&input,roiX,roiY,width,height,
                 intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start[1]);
    }
  }
  else if (1 < roiWidth && uVar4 == 0) {
    width = roiWidth >> 1;
    height = roiHeight;
    goto LAB_001504bf;
  }
  (*Flip)(&output,&input,roiX,roiY,roiWidth,roiHeight,uVar4 == 0,(uVar5 & 1) == 0);
  bVar3 = Unit_Test::equalSize(&output,roiWidth,roiHeight);
  if (bVar3) {
    if ((uVar5 & 1) == 0) {
      bVar3 = Unit_Test::verifyImage
                        (&output,0,0,roiWidth,(roiHeight >> 1) + (uVar1 & 1),
                         *intensity.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      if (bVar3) {
        if (1 < roiHeight) {
          bVar3 = Unit_Test::verifyImage
                            (&output,0,(uVar1 & 1) + (roiHeight >> 1),roiWidth,roiHeight >> 1,
                             intensity.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start[1]);
LAB_001505e4:
          if (bVar3 == false) goto LAB_001505ec;
        }
LAB_001505e8:
        bVar3 = true;
        goto LAB_001505ee;
      }
    }
    else {
      bVar3 = Unit_Test::verifyImage
                        (&output,0,0,(roiWidth >> 1) + (uVar2 & 1),roiHeight,
                         *intensity.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      if (bVar3) {
        if (1 < roiWidth) {
          bVar3 = Unit_Test::verifyImage
                            (&output,(uVar2 & 1) + (roiWidth >> 1),0,roiWidth >> 1,roiHeight,
                             intensity.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start[(ulong)uVar4 ^ 1]);
          goto LAB_001505e4;
        }
        goto LAB_001505e8;
      }
    }
  }
LAB_001505ec:
  bVar3 = false;
LAB_001505ee:
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  input._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&input);
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool form3_Flip(FlipForm3 Flip)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image input = uniformImage( intensity[0] );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const bool horizontalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const bool verticalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const uint32_t xCorrection = roiWidth % 2;
        const uint32_t yCorrection = roiHeight % 2;

        if (verticalFlip)
        {
            if (roiHeight > 1)
                Image_Function::Fill(input, roiX, roiY, roiWidth, roiHeight / 2, intensity[1]);
        }
        else if (horizontalFlip)
        {
            if (roiWidth > 1)
                Image_Function::Fill(input, roiX, roiY, roiWidth / 2, roiHeight, intensity[1]);
        }

        const PenguinV_Image::Image output = Flip( input, roiX, roiY, roiWidth, roiHeight, horizontalFlip, verticalFlip );

        if( !equalSize( output, roiWidth, roiHeight ))
            return false;

        if (verticalFlip) {
            if( !verifyImage( output, 0, 0, roiWidth, roiHeight / 2 + yCorrection, intensity[0] ) )
                return false;
            if((roiHeight > 1) && !verifyImage( output, 0, roiHeight / 2 + yCorrection, roiWidth, roiHeight / 2, intensity[1] ) )
                return false;
        }
        else {
            if( !verifyImage( output, 0, 0, roiWidth / 2 + xCorrection, roiHeight, intensity[0] ) )
                return false;
            if((roiWidth > 1) && !verifyImage( output, roiWidth / 2 + xCorrection, 0, roiWidth / 2, roiHeight, intensity[horizontalFlip ? 1 : 0] ) )
                return false;
        }

        return true;
    }